

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O2

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::update_remove
          (DynamicPartialIndex *this,vertex_t s,vertex_t t,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *reverse_graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  byte bVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  pointer puVar3;
  byte *pbVar4;
  
  pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)s);
  if (*pbVar4 < this->k_) {
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)t);
    if (*pbVar4 <= this->k_) {
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)s);
      bVar1 = *pbVar4;
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)t);
      if (bVar1 + 1 == (uint)*pbVar4) {
        pvVar2 = this->updated_;
        puVar3 = (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish != puVar3) {
          (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = puVar3;
        }
        collect_changes(this,t,graph,reverse_graph,dist);
        fix_changes(this,graph,reverse_graph,dist);
        return;
      }
    }
  }
  return;
}

Assistant:

void DynamicScalableKReach::DynamicPartialIndex::update_remove(vertex_t s, vertex_t t,
                                                               const std::vector<std::vector<vertex_t>> &graph,
                                                               const std::vector<std::vector<vertex_t>> &reverse_graph,
                                                               std::vector<distance_t> &dist) {
    if (dist.at(s) >= k_ || dist.at(t) > k_ || dist.at(s) + 1 != dist.at(t)) {
        return;
    }
    updated_.clear();
    collect_changes(t, graph, reverse_graph, dist);
    fix_changes(graph, reverse_graph, dist);
}